

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptArray::SetProperty
          (JavascriptArray *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  undefined8 in_RAX;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  uint local_34 [2];
  uint32 indexValue;
  
  local_34[0] = (uint)((ulong)in_RAX >> 0x20);
  bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  if (bVar1) {
    this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(this);
  }
  else {
    this_00 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
  }
  if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
  }
  if (propertyId == 0xd1) {
    SetLength(this,value);
    iVar3 = 1;
  }
  else {
    BVar2 = ScriptContext::IsNumericPropertyId
                      ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type
                          .ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
                       .ptr,propertyId,local_34);
    if (BVar2 == 0) {
      iVar3 = DynamicObject::SetProperty((DynamicObject *)this,propertyId,value,flags,info);
    }
    else {
      iVar3 = (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x29])(this,(ulong)local_34[0],value,(ulong)flags);
    }
  }
  return iVar3;
}

Assistant:

BOOL JavascriptArray::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        uint32 indexValue;
        if (propertyId == PropertyIds::length)
        {
            return this->SetLength(value);
        }
        else if (GetScriptContext()->IsNumericPropertyId(propertyId, &indexValue))
        {
            // Call this or subclass method
            return SetItem(indexValue, value, flags);
        }
        else
        {
            return DynamicObject::SetProperty(propertyId, value, flags, info);
        }
    }